

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O1

void PrefOpSize(PDISASM pMyDisasm)

{
  REX_Struct *pRVar1;
  Int32 *pIVar2;
  UInt8 UVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  _func_void_PDISASM **pp_Var7;
  Int32 IVar8;
  
  uVar5 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar5 != 0) && (uVar5 < (pMyDisasm->Reserved_).EIP_ + 2)) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    return;
  }
  (pMyDisasm->Prefix).OperandSize = '\x01';
  UVar3 = (pMyDisasm->Reserved_).VEX.state;
  if (UVar3 == '\x01') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  pRVar1 = &(pMyDisasm->Reserved_).REX;
  if (((pMyDisasm->Reserved_).REX.state == '\x01') && (pRVar1->W_ == '\x01')) {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  }
  (pMyDisasm->Reserved_).REX.state = '\0';
  pRVar1->W_ = '\0';
  pRVar1->R_ = '\0';
  pRVar1->X_ = '\0';
  pRVar1->B_ = '\0';
  pbVar6 = (byte *)((pMyDisasm->Reserved_).EIP_ + 1);
  (pMyDisasm->Reserved_).EIP_ = (UIntPtr)pbVar6;
  (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
  pIVar2 = &(pMyDisasm->Reserved_).NB_PREFIX;
  *pIVar2 = *pIVar2 + 1;
  iVar4 = (pMyDisasm->Reserved_).OperandSize;
  (pMyDisasm->Reserved_).OriginalOperandSize = iVar4;
  IVar8 = 0x20;
  if (((pMyDisasm->Reserved_).Architecture == 0x10) || (IVar8 = 0x10, iVar4 != 0x40)) {
    (pMyDisasm->Reserved_).OperandSize = IVar8;
  }
  (pMyDisasm->Instruction).Opcode = (uint)*pbVar6;
  if (UVar3 == '\x01') {
    UVar3 = (pMyDisasm->Reserved_).VEX.mmmmm;
    if (UVar3 == '\x03') {
      uVar5 = (ulong)*pbVar6;
      pp_Var7 = opcode_map4;
    }
    else if (UVar3 == '\x02') {
      uVar5 = (ulong)*pbVar6;
      pp_Var7 = opcode_map3;
    }
    else {
      if (UVar3 != '\x01') {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
        (pMyDisasm->Operand1).AccessMode = 0;
        (pMyDisasm->Operand2).AccessMode = 0;
        (pMyDisasm->Operand3).AccessMode = 0;
        (pMyDisasm->Operand4).AccessMode = 0;
        (pMyDisasm->Operand5).AccessMode = 0;
        (pMyDisasm->Operand6).AccessMode = 0;
        (pMyDisasm->Operand7).AccessMode = 0;
        (pMyDisasm->Operand8).AccessMode = 0;
        (pMyDisasm->Operand9).AccessMode = 0;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
        goto LAB_0010d7d5;
      }
      uVar5 = (ulong)*pbVar6;
      pp_Var7 = opcode_map2;
    }
  }
  else {
    uVar5 = (ulong)*pbVar6;
    pp_Var7 = opcode_map1;
  }
  (*pp_Var7[uVar5])(pMyDisasm);
LAB_0010d7d5:
  if ((pMyDisasm->Reserved_).Architecture == 0x10) {
    (pMyDisasm->Reserved_).OperandSize = 0x10;
  }
  else {
    (pMyDisasm->Reserved_).OperandSize = 0x20;
  }
  return;
}

Assistant:

void __bea_callspec__ PrefOpSize(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    pMyDisasm->Prefix.OperandSize = InUsePrefix;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    GV.OriginalOperandSize = GV.OperandSize;  /* if GV.OperandSize is used as a mandatory prefix, keep the real operandsize value */
    if (GV.Architecture == 16) {
        GV.OperandSize = 32;
    }
    else {
        if (GV.OperandSize != 64) {
            GV.OperandSize = 16;
        }
    }
    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    if (GV.VEX.state != InUsePrefix) {
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x1) {
        (void) opcode_map2[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x2) {
        (void) opcode_map3[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else if (GV.VEX.mmmmm == 0x3) {
        (void) opcode_map4[*((UInt8*) GV.EIP_)](pMyDisasm);
    }
    else {
        failDecode(pMyDisasm);
    }
    if (GV.Architecture == 16) {
        GV.OperandSize = 16;
    }
    else {
        GV.OperandSize = 32;
    }
}